

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O2

HRRDoubletStepList * __thiscall
OSTEI_HRR_Algorithm_Base::GetKetSteps
          (HRRDoubletStepList *__return_storage_ptr__,OSTEI_HRR_Algorithm_Base *this,DAM *am)

{
  size_type sVar1;
  mapped_type *__x;
  undefined1 auStack_48 [40];
  
  DAM::notag((DAM *)auStack_48,am);
  sVar1 = std::
          map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
          ::count(&this->ketsteps_,(key_type *)auStack_48);
  std::__cxx11::string::~string((string *)(auStack_48 + 8));
  if (sVar1 == 0) {
    (__return_storage_ptr__->super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    DAM::notag((DAM *)auStack_48,am);
    __x = std::
          map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
          ::at(&this->ketsteps_,(key_type *)auStack_48);
    std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::vector(__return_storage_ptr__,__x)
    ;
    std::__cxx11::string::~string((string *)(auStack_48 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

HRRDoubletStepList OSTEI_HRR_Algorithm_Base::GetKetSteps(DAM am) const
{
    if(ketsteps_.count(am.notag()))
        return ketsteps_.at(am.notag());
    else
        return HRRDoubletStepList();
}